

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O2

void S_RestoreEvictedChannel(FSoundChan *chan)

{
  uint uVar1;
  
  if (chan != (FSoundChan *)0x0) {
    S_RestoreEvictedChannel(chan->NextChan);
    if ((chan->ChanFlags & 2U) == 0) {
      if (((chan->ChanFlags & 0x104U) == 4) &&
         ((chan->super_FISoundChannel).SysChannel == (void *)0x0)) {
LAB_003229fb:
        S_ReturnChannel(chan);
        return;
      }
    }
    else {
      S_RestartSound(chan);
      uVar1 = chan->ChanFlags;
      if ((uVar1 >> 8 & 1) == 0) {
        if ((uVar1 & 2) != 0) goto LAB_003229fb;
        if ((uVar1 >> 9 & 1) == 0) {
          chan->ChanFlags = uVar1 | 4;
        }
      }
    }
  }
  return;
}

Assistant:

void S_RestoreEvictedChannel(FSoundChan *chan)
{
	if (chan == NULL)
	{
		return;
	}
	S_RestoreEvictedChannel(chan->NextChan);
	if (chan->ChanFlags & CHAN_EVICTED)
	{
		S_RestartSound(chan);
		if (!(chan->ChanFlags & CHAN_LOOP))
		{
			if (chan->ChanFlags & CHAN_EVICTED)
			{ // Still evicted and not looping? Forget about it.
				S_ReturnChannel(chan);
			}
			else if (!(chan->ChanFlags & CHAN_JUSTSTARTED))
			{ // Should this sound become evicted again, it's okay to forget about it.
				chan->ChanFlags |= CHAN_FORGETTABLE;
			}
		}
	}
	else if (chan->SysChannel == NULL && (chan->ChanFlags & (CHAN_FORGETTABLE | CHAN_LOOP)) == CHAN_FORGETTABLE)
	{
		S_ReturnChannel(chan);
	}
}